

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTest.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint32_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool pred;
  uint32_t uVar3;
  size_t x;
  uint64_t uVar4;
  ulong uVar5;
  uchar *md;
  string *md_00;
  string *md_01;
  string *md_02;
  string *md_03;
  string *md_04;
  string *md_05;
  string *md_06;
  string *psVar6;
  size_t n;
  size_t n_00;
  size_t n_01;
  string nonce;
  SHA256 sha256;
  MD5 md5;
  string password_sha256_sha256;
  string result;
  string hash_with_nonce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar6 = &nonce;
  md_00 = &nonce;
  md_01 = &nonce;
  md_02 = &nonce;
  md_03 = &nonce;
  md_04 = &nonce;
  md_05 = &nonce;
  md_06 = &nonce;
  puts("-- crc32");
  uVar3 = phosg::crc32((void *)0x0,0,0);
  phosg::expect_generic
            (uVar3 == 0,"0x00000000 != crc32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x18);
  uVar3 = phosg::crc32(anon_var_dwarf_2cf + 0x14,0,0);
  phosg::expect_generic
            (uVar3 == 0,"0x00000000 != crc32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x19);
  uVar3 = phosg::crc32("A",1,0);
  phosg::expect_generic
            (uVar3 == 0xd3d99e8b,"0xD3D99E8B != crc32(\"A\", 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1a);
  uVar3 = phosg::crc32("omg",3,0);
  phosg::expect_generic
            (uVar3 == 0xbf4fb41e,"0xBF4FB41E != crc32(\"omg\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1b);
  uVar3 = phosg::crc32("omg hax",7,0);
  phosg::expect_generic
            (uVar3 == 0xbb24c2e5,"0xBB24C2E5 != crc32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1c);
  uVar3 = phosg::crc32("The quick brown fox jumps over the lazy dog",0x2b,0);
  phosg::expect_generic
            (uVar3 == 0x414fa339,
             "0x414FA339 != crc32(\"The quick brown fox jumps over the lazy dog\", 43)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1d);
  puts("-- fnv1a32");
  uVar3 = phosg::fnv1a32((void *)0x0,0,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x22);
  uVar3 = phosg::fnv1a32(anon_var_dwarf_2cf + 0x14,0,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x23);
  uVar3 = phosg::fnv1a32("omg hax",7,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0x36e1dfd3,"0x36E1DFD3 != fnv1a32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x24);
  uVar3 = phosg::fnv1a32("lollercoaster",0xd,0x811c9dc5);
  phosg::expect_generic
            (uVar3 == 0xa73ca50,"0x0A73CA50 != fnv1a32(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x25);
  puts("-- fnv1a64");
  uVar4 = phosg::fnv1a64((void *)0x0,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2a);
  uVar4 = phosg::fnv1a64(anon_var_dwarf_2cf + 0x14,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2b);
  uVar4 = phosg::fnv1a64("omg hax",7,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar4 == 0xe6cac1f92eb65713,"0xE6CAC1F92EB65713 != fnv1a64(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2c);
  uVar4 = phosg::fnv1a64("lollercoaster",0xd,0xcbf29ce484222325);
  md = (uchar *)0x2d;
  phosg::expect_generic
            (uVar4 == 0x594b81fb565e8d30,"0x594B81FB565E8D30 != fnv1a64(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2d);
  puts("-- md5");
  phosg::MD5::MD5(&md5,(uchar *)0x0,0,md);
  puVar1 = sha256.h + 4;
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_268,anon_var_dwarf_268 + 0x10);
  phosg::MD5::bin_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x33,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"D41D8CD98F00B204E9800998ECF8427E",
             (allocator<char> *)&password_sha256_sha256);
  phosg::MD5::hex_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x34,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::MD5::MD5((MD5 *)&sha256,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)psVar6);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_268,anon_var_dwarf_268 + 0x10);
  phosg::MD5::bin_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x36,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"D41D8CD98F00B204E9800998ECF8427E",
             (allocator<char> *)&password_sha256_sha256);
  phosg::MD5::hex_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x37,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::MD5::MD5((MD5 *)&sha256,(uchar *)"omg hax",7,(uchar *)md_00);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_294,anon_var_dwarf_294 + 0x10);
  phosg::MD5::bin_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x39,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"FAC7E18ED6599B377C60F2CA94CCB45B",
             (allocator<char> *)&password_sha256_sha256);
  phosg::MD5::hex_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3a,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::MD5::MD5((MD5 *)&sha256,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                  (uchar *)md_01);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_2a8,anon_var_dwarf_2a8 + 0x10);
  phosg::MD5::bin_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3c,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"9E107D9D372BB6826BD81D3542A419D6",
             (allocator<char> *)&password_sha256_sha256);
  phosg::MD5::hex_abi_cxx11_(&nonce,&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3d,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  puts("-- sha1");
  phosg::SHA1::SHA1((SHA1 *)&md5,(uchar *)0x0,0,(uchar *)md_02);
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_2cf,anon_var_dwarf_2cf + 0x14);
  phosg::SHA1::bin_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x43,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA1::hex_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x44,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::SHA1::SHA1((SHA1 *)&sha256,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)md_03);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_2cf,anon_var_dwarf_2cf + 0x14);
  phosg::SHA1::bin_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x46,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA1::hex_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x47,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::SHA1::SHA1((SHA1 *)&sha256,(uchar *)"omg hax",7,(uchar *)md_04);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_2e3,anon_var_dwarf_2e3 + 0x14);
  phosg::SHA1::bin_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x49,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"6A30D0343ED1313696D20BCC25FA7E2AD5A9777F",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA1::hex_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4a,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  phosg::SHA1::SHA1((SHA1 *)&sha256,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                    (uchar *)md_05);
  md5.a0 = sha256.h[0];
  md5.b0 = sha256.h[1];
  md5.c0 = sha256.h[2];
  md5.d0 = sha256.h[3];
  sha256.h._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sha256,anon_var_dwarf_2f7,anon_var_dwarf_2f7 + 0x14);
  phosg::SHA1::bin_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4c,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sha256,"2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA1::hex_abi_cxx11_(&nonce,(SHA1 *)&md5);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4d,(string *)&sha256,&nonce);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::~string((string *)&sha256);
  puts("-- sha256");
  phosg::SHA256::SHA256(&sha256,(uchar *)0x0,0,(uchar *)md_06);
  paVar2 = &nonce.field_2;
  nonce._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,anon_var_dwarf_312,anon_var_dwarf_312 + 0x20);
  phosg::SHA256::bin_abi_cxx11_((string *)&md5,&sha256);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x53,&nonce,(string *)&md5);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonce,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA256::hex_abi_cxx11_((string *)&md5,&sha256);
  psVar6 = (string *)&md5;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x54,&nonce,psVar6);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  phosg::SHA256::SHA256((SHA256 *)&nonce,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)psVar6);
  sha256.h[4] = nonce.field_2._M_allocated_capacity._0_4_;
  sha256.h[5] = nonce.field_2._M_allocated_capacity._4_4_;
  sha256.h[6] = nonce.field_2._8_4_;
  sha256.h[7] = nonce.field_2._12_4_;
  sha256.h._0_8_ = nonce._M_dataplus._M_p;
  sha256.h[2] = (uint32_t)nonce._M_string_length;
  sha256.h[3] = nonce._M_string_length._4_4_;
  nonce._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,anon_var_dwarf_312,anon_var_dwarf_312 + 0x20);
  phosg::SHA256::bin_abi_cxx11_((string *)&md5,&sha256);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x56,&nonce,(string *)&md5);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonce,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA256::hex_abi_cxx11_((string *)&md5,&sha256);
  psVar6 = (string *)&md5;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x57,&nonce,psVar6);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  phosg::SHA256::SHA256((SHA256 *)&nonce,(uchar *)"omg hax",7,(uchar *)psVar6);
  sha256.h[4] = nonce.field_2._M_allocated_capacity._0_4_;
  sha256.h[5] = nonce.field_2._M_allocated_capacity._4_4_;
  sha256.h[6] = nonce.field_2._8_4_;
  sha256.h[7] = nonce.field_2._12_4_;
  sha256.h._0_8_ = nonce._M_dataplus._M_p;
  sha256.h[2] = (uint32_t)nonce._M_string_length;
  sha256.h[3] = nonce._M_string_length._4_4_;
  nonce._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,anon_var_dwarf_332,anon_var_dwarf_332 + 0x20);
  phosg::SHA256::bin_abi_cxx11_((string *)&md5,&sha256);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x59,&nonce,(string *)&md5);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonce,"C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA256::hex_abi_cxx11_((string *)&md5,&sha256);
  psVar6 = (string *)&md5;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5a,&nonce,psVar6);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  phosg::SHA256::SHA256
            ((SHA256 *)&nonce,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
             (uchar *)psVar6);
  sha256.h[4] = nonce.field_2._M_allocated_capacity._0_4_;
  sha256.h[5] = nonce.field_2._M_allocated_capacity._4_4_;
  sha256.h[6] = nonce.field_2._8_4_;
  sha256.h[7] = nonce.field_2._12_4_;
  sha256.h._0_8_ = nonce._M_dataplus._M_p;
  sha256.h[2] = (uint32_t)nonce._M_string_length;
  sha256.h[3] = nonce._M_string_length._4_4_;
  nonce._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,anon_var_dwarf_346,anon_var_dwarf_346 + 0x20);
  phosg::SHA256::bin_abi_cxx11_((string *)&md5,&sha256);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5c,&nonce,(string *)&md5);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonce,"D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592",
             (allocator<char> *)&password_sha256_sha256);
  phosg::SHA256::hex_abi_cxx11_((string *)&md5,&sha256);
  psVar6 = (string *)&md5;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5d,&nonce,psVar6);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonce,"\x15R\x16p\x06u\"\x18wCS\x14q\x01C%S\x1fj\x14",
             (allocator<char> *)&md5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hash_with_nonce,"root",(allocator<char> *)&result);
  phosg::SHA256::SHA256
            ((SHA256 *)&password_sha256_sha256,(uchar *)&hash_with_nonce,n,(uchar *)psVar6);
  phosg::SHA256::bin_abi_cxx11_((string *)&md5,(SHA256 *)&password_sha256_sha256);
  std::__cxx11::string::~string((string *)&hash_with_nonce);
  phosg::SHA256::SHA256((SHA256 *)&hash_with_nonce,(uchar *)&md5,n_00,(uchar *)psVar6);
  phosg::SHA256::bin_abi_cxx11_(&password_sha256_sha256,(SHA256 *)&hash_with_nonce);
  std::operator+(&local_50,&password_sha256_sha256,&nonce);
  phosg::SHA256::SHA256((SHA256 *)&result,(uchar *)&local_50,n_01,(uchar *)psVar6);
  phosg::SHA256::bin_abi_cxx11_(&hash_with_nonce,(SHA256 *)&result);
  std::__cxx11::string::~string((string *)&local_50);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&result,0x20,'\0');
  for (uVar5 = 0; uVar5 < result._M_string_length; uVar5 = uVar5 + 1) {
    result._M_dataplus._M_p[uVar5] =
         hash_with_nonce._M_dataplus._M_p[uVar5] ^ *(byte *)(CONCAT44(md5.b0,md5.a0) + uVar5);
  }
  pred = std::operator==(&result,anon_var_dwarf_37a);
  phosg::expect_generic
            (pred,
             "result != \"\\x1A\\xE1\\x80\\xD5\\xE5\\xDB\\x7F\\xDF\\x59\\xEA\\x73\\x91\\xB6\\x5E\\x25\\x16\\x73\\xE1\\xB0\\x01\\xC1\\x50\\xAA\\x3A\\x48\\xDC\\x78\\x48\\x8B\\x4B\\x70\\xC4\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x68);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&hash_with_nonce);
  std::__cxx11::string::~string((string *)&password_sha256_sha256);
  std::__cxx11::string::~string((string *)&md5);
  std::__cxx11::string::~string((string *)&nonce);
  puts("HashTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- crc32\n");
    expect_eq(0x00000000, crc32(nullptr, 0));
    expect_eq(0x00000000, crc32("", 0));
    expect_eq(0xD3D99E8B, crc32("A", 1));
    expect_eq(0xBF4FB41E, crc32("omg", 3));
    expect_eq(0xBB24C2E5, crc32("omg hax", 7));
    expect_eq(0x414FA339, crc32("The quick brown fox jumps over the lazy dog", 43));
  }

  {
    printf("-- fnv1a32\n");
    expect_eq(0x811C9DC5, fnv1a32(nullptr, 0)); // technically undefined, but should work
    expect_eq(0x811C9DC5, fnv1a32("", 0));
    expect_eq(0x36E1DFD3, fnv1a32("omg hax", 7));
    expect_eq(0x0A73CA50, fnv1a32("lollercoaster", 13));
  }

  {
    printf("-- fnv1a64\n");
    expect_eq(0xCBF29CE484222325, fnv1a64(nullptr, 0)); // technically undefined, but should work
    expect_eq(0xCBF29CE484222325, fnv1a64("", 0));
    expect_eq(0xE6CAC1F92EB65713, fnv1a64("omg hax", 7));
    expect_eq(0x594B81FB565E8D30, fnv1a64("lollercoaster", 13));
  }

  {
    printf("-- md5\n");
    MD5 md5(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("", 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xFA\xC7\xE1\x8E\xD6\x59\x9B\x37\x7C\x60\xF2\xCA\x94\xCC\xB4\x5B", 16), md5.bin());
    check_string(__FILE__, __LINE__, "FAC7E18ED6599B377C60F2CA94CCB45B", md5.hex());
    md5 = MD5("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x9E\x10\x7D\x9D\x37\x2B\xB6\x82\x6B\xD8\x1D\x35\x42\xA4\x19\xD6", 16), md5.bin());
    check_string(__FILE__, __LINE__, "9E107D9D372BB6826BD81D3542A419D6", md5.hex());
  }

  {
    printf("-- sha1\n");
    SHA1 sha1(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("", 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\x6A\x30\xD0\x34\x3E\xD1\x31\x36\x96\xD2\x0B\xCC\x25\xFA\x7E\x2A\xD5\xA9\x77\x7F", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "6A30D0343ED1313696D20BCC25FA7E2AD5A9777F", sha1.hex());
    sha1 = SHA1("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x2F\xD4\xE1\xC6\x7A\x2D\x28\xFC\xED\x84\x9E\xE1\xBB\x76\xE7\x39\x1B\x93\xEB\x12", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12", sha1.hex());
  }

  {
    printf("-- sha256\n");
    SHA256 sha256(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("", 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xC8\xFE\x90\x95\x16\x38\x92\x36\x7A\x31\xCE\xC8\x90\x25\xA8\xD8\x39\x4B\x47\x4D\x38\x8F\x10\xD4\x7A\x0F\xCC\x02\x19\xA7\x74\x30", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430", sha256.hex());
    sha256 = SHA256("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\xD7\xA8\xFB\xB3\x07\xD7\x80\x94\x69\xCA\x9A\xBC\xB0\x08\x2E\x4F\x8D\x56\x51\xE4\x6D\x3C\xDB\x76\x2D\x02\xD0\xBF\x37\xC9\xE5\x92", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592", sha256.hex());

    // MySQL caching_sha2_password challenge/response test (password = "root")
    string nonce = "\x15\x52\x16\x70\x06\x75\x22\x18\x77\x43\x53\x14\x71\x01\x43\x25\x53\x1F\x6A\x14";
    string password_sha256 = SHA256("root").bin();
    string password_sha256_sha256 = SHA256(password_sha256).bin();
    string hash_with_nonce = SHA256(password_sha256_sha256 + nonce).bin();
    string result(0x20, '\0');
    for (size_t x = 0; x < result.size(); x++) {
      result[x] = password_sha256[x] ^ hash_with_nonce[x];
    }
    expect_eq(result, "\x1A\xE1\x80\xD5\xE5\xDB\x7F\xDF\x59\xEA\x73\x91\xB6\x5E\x25\x16\x73\xE1\xB0\x01\xC1\x50\xAA\x3A\x48\xDC\x78\x48\x8B\x4B\x70\xC4");
  }

  printf("HashTest: all tests passed\n");
  return 0;
}